

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb_emu.c
# Opt level: O1

gbstatus_e gb_emu_init(gb_emu_t *gb_emu)

{
  gb_mmu_t *mmu;
  gbstatus_e gVar1;
  
  if (gb_emu != (gb_emu_t *)0x0) {
    cpu_init((gb_cpu_t *)gb_emu,&gb_emu->gb);
    int_init(&(gb_emu->gb).intr_ctrl,&gb_emu->gb);
    timer_init(&(gb_emu->gb).timer,&gb_emu->gb);
    joypad_init(&(gb_emu->gb).joypad,&gb_emu->gb);
    mmu = &(gb_emu->gb).mmu;
    gVar1 = mmu_init(mmu,&gb_emu->gb);
    if (gVar1 == GBSTATUS_OK) {
      gVar1 = ppu_init(&(gb_emu->gb).ppu,&gb_emu->gb);
      if (gVar1 == GBSTATUS_OK) {
        gb_emu->cart_inserted = false;
        gVar1 = GBSTATUS_OK;
      }
      else {
        mmu_deinit(mmu);
      }
    }
    return gVar1;
  }
  __assert_fail("gb_emu != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/gb_emu.c"
                ,8,"gbstatus_e gb_emu_init(gb_emu_t *)");
}

Assistant:

gbstatus_e gb_emu_init(gb_emu_t *gb_emu)
{
    gbstatus_e status = GBSTATUS_OK;

    assert(gb_emu != NULL);

    gb_t *gb = &gb_emu->gb;

    cpu_init   (&gb->cpu      , gb);
    int_init   (&gb->intr_ctrl, gb);
    timer_init (&gb->timer    , gb);
    joypad_init(&gb->joypad   , gb);

    status = mmu_init(&gb->mmu, gb);
    if (status != GBSTATUS_OK)
        goto error_handler0;

    status = ppu_init(&gb->ppu, gb);
    if (status != GBSTATUS_OK)
        goto error_handler1;

    gb_emu->cart_inserted = false;
    return GBSTATUS_OK;

error_handler1:
    mmu_deinit(&gb->mmu);

error_handler0:
    return status;
}